

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<const_kj::File> __thiscall
kj::anon_unknown_8::DiskDirectory::createTemporary(DiskDirectory *this)

{
  PathPtr finalName;
  int iVar1;
  long lVar2;
  Clock *clock;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *pFVar3;
  long in_RSI;
  undefined8 __name;
  DiskHandle *this_00;
  StringPtr name;
  Own<const_kj::File> OVar4;
  int newFd_;
  AutoCloseFd newFd;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_90;
  AutoCloseFd newFd_1;
  AutoCloseFd local_60;
  Fault f;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_50;
  Fault f_1;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_30;
  
  this_00 = (DiskHandle *)(in_RSI + 8);
  do {
    lVar2 = syscall(0x101,(ulong)(uint)(this_00->fd).fd,".",0x410002,0x1c0);
    newFd_ = (int)lVar2;
    if (-1 < newFd_) goto LAB_0028474d;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (1 < iVar1 - 0x15U) {
    if (iVar1 == 0) {
LAB_0028474d:
      newFd.fd = newFd_;
      UnwindDetector::UnwindDetector(&newFd.unwindDetector);
      AutoCloseFd::AutoCloseFd(&newFd_1,&newFd);
      newDiskFile((kj *)&f,&newFd_1);
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)CONCAT71(f.exception._1_7_,(char)f.exception);
      (this->super_DiskHandle).fd = (AutoCloseFd)aStack_50.value.content.ptr;
      Own<kj::File>::dispose((Own<kj::File> *)&f);
      AutoCloseFd::~AutoCloseFd(&newFd_1);
      AutoCloseFd::~AutoCloseFd(&newFd);
      pFVar3 = extraout_RDX;
      goto LAB_0028498e;
    }
    if (iVar1 != 0x5f) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x539,iVar1,"open(O_TMPFILE)","");
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  name.content.size_ = 8;
  name.content.ptr = "unnamed";
  Path::Path((Path *)&newFd_1,name);
  finalName.parts._4_12_ = stack0xffffffffffffff8c;
  finalName.parts.ptr._0_4_ = newFd_1.fd;
  local_30.ptr = (Iface *)operator_new(0x18);
  (local_30.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0030e8b0;
  local_30.ptr[1]._vptr_Iface = (_func_int **)&newFd_;
  local_30.ptr[2]._vptr_Iface = (_func_int **)this_00;
  local_30.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::createTemporary()const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            ((Maybe<kj::String> *)&newFd,this_00,finalName,CREATE,
             (Function<int_(kj::StringPtr)> *)&local_30);
  f.exception._0_1_ = (char)newFd.fd;
  if ((char)newFd.fd == '\x01') {
    aStack_50.value.content.ptr = aStack_90.value.content.ptr;
    aStack_50.value.content.size_ = aStack_90.value.content.size_;
    aStack_90.value.content.ptr = (char *)0x0;
  }
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&newFd);
  Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(&local_30);
  Array<kj::String>::~Array((Array<kj::String> *)&newFd_1);
  if ((char)f.exception == '\x01') {
    newFd_1.fd = newFd_;
    UnwindDetector::UnwindDetector(&newFd_1.unwindDetector);
    AutoCloseFd::AutoCloseFd(&local_60,&newFd_1);
    newDiskFile((kj *)&newFd,&local_60);
    AutoCloseFd::~AutoCloseFd(&local_60);
    do {
      __name = (long)"\n\n" + 2;
      if (aStack_50.value.content.size_ != 0) {
        __name = aStack_50.value.content.ptr;
      }
      iVar1 = unlinkat((this_00->fd).fd,(char *)__name,0);
      if (-1 < iVar1) goto LAB_0028493c;
      iVar1 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      kj::_::Debug::Fault::Fault
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x54d,iVar1,"unlinkat(fd, temp->cStr(), 0)","");
      kj::_::Debug::Fault::~Fault(&f_1);
    }
LAB_0028493c:
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)CONCAT44(newFd.unwindDetector.uncaughtCount,newFd.fd);
    (this->super_DiskHandle).fd = (AutoCloseFd)aStack_90.value.content.ptr;
    Own<kj::File>::dispose((Own<kj::File> *)&newFd);
    AutoCloseFd::~AutoCloseFd(&newFd_1);
  }
  else {
    clock = nullClock();
    newInMemoryFile((kj *)&newFd,clock);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)CONCAT44(newFd.unwindDetector.uncaughtCount,newFd.fd);
    (this->super_DiskHandle).fd = (AutoCloseFd)aStack_90.value.content.ptr;
    Own<kj::File>::dispose((Own<kj::File> *)&newFd);
  }
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f);
  pFVar3 = extraout_RDX_00;
LAB_0028498e:
  OVar4.ptr = pFVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }